

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToDrawData(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  int *piVar1;
  ImGuiWindow *window_00;
  int iVar2;
  long lVar3;
  
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  AddDrawListToDrawData(out_render_list,window->DrawList);
  iVar2 = (window->DC).ChildWindows.Size;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar3];
      if ((window_00->Active == true) && (window_00->Hidden == false)) {
        AddWindowToDrawData(out_render_list,window_00);
        iVar2 = (window->DC).ChildWindows.Size;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImVector<ImDrawList*>* out_render_list, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // clipped children may have been marked not active
            AddWindowToDrawData(out_render_list, child);
    }
}